

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Imputer.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::Imputer::Imputer(Imputer *this,Imputer *from)

{
  ImputedValueCase IVar1;
  ReplaceValueCase RVar2;
  InternalMetadataWithArenaLite *this_00;
  int64 iVar3;
  string *psVar4;
  DoubleVector *this_01;
  DoubleVector *from_00;
  Int64Vector *this_02;
  Int64Vector *from_01;
  StringToDoubleMap *this_03;
  StringToDoubleMap *from_02;
  Int64ToDoubleMap *this_04;
  Int64ToDoubleMap *from_03;
  double dVar5;
  Imputer *from_local;
  Imputer *this_local;
  Container *local_20;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__Imputer_00624fe8;
  google::protobuf::internal::InternalMetadataWithArenaLite::InternalMetadataWithArenaLite
            (&this->_internal_metadata_,(Arena *)0x0);
  ImputedValueUnion::ImputedValueUnion
            ((ImputedValueUnion *)&(this->ImputedValue_).imputedstringvalue_);
  ReplaceValueUnion::ReplaceValueUnion
            ((ReplaceValueUnion *)&(this->ReplaceValue_).replacestringvalue_);
  this->_cached_size_ = 0;
  this_00 = &from->_internal_metadata_;
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
             ).ptr_ & 1) == 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
               ).ptr_ & 1) == 1) {
      local_20 = google::protobuf::internal::
                 InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>::Container>
                           ((InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                             *)this_00);
    }
    else {
      local_20 = (Container *)
                 google::protobuf::internal::InternalMetadataWithArenaLite::
                 default_instance_abi_cxx11_();
    }
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,&local_20->unknown_fields);
  }
  clear_has_ImputedValue(this);
  IVar1 = ImputedValue_case(from);
  switch(IVar1) {
  case IMPUTEDVALUE_NOT_SET:
    break;
  case kImputedDoubleValue:
    dVar5 = imputeddoublevalue(from);
    set_imputeddoublevalue(this,dVar5);
    break;
  case kImputedInt64Value:
    iVar3 = imputedint64value(from);
    set_imputedint64value(this,iVar3);
    break;
  case kImputedStringValue:
    psVar4 = imputedstringvalue_abi_cxx11_(from);
    set_imputedstringvalue(this,psVar4);
    break;
  case kImputedDoubleArray:
    this_01 = mutable_imputeddoublearray(this);
    from_00 = imputeddoublearray(from);
    DoubleVector::MergeFrom(this_01,from_00);
    break;
  case kImputedInt64Array:
    this_02 = mutable_imputedint64array(this);
    from_01 = imputedint64array(from);
    Int64Vector::MergeFrom(this_02,from_01);
    break;
  case kImputedStringDictionary:
    this_03 = mutable_imputedstringdictionary(this);
    from_02 = imputedstringdictionary(from);
    StringToDoubleMap::MergeFrom(this_03,from_02);
    break;
  case kImputedInt64Dictionary:
    this_04 = mutable_imputedint64dictionary(this);
    from_03 = imputedint64dictionary(from);
    Int64ToDoubleMap::MergeFrom(this_04,from_03);
  }
  clear_has_ReplaceValue(this);
  RVar2 = ReplaceValue_case(from);
  switch(RVar2) {
  case REPLACEVALUE_NOT_SET:
    break;
  case kReplaceDoubleValue:
    dVar5 = replacedoublevalue(from);
    set_replacedoublevalue(this,dVar5);
    break;
  case kReplaceInt64Value:
    iVar3 = replaceint64value(from);
    set_replaceint64value(this,iVar3);
    break;
  case kReplaceStringValue:
    psVar4 = replacestringvalue_abi_cxx11_(from);
    set_replacestringvalue(this,psVar4);
  }
  return;
}

Assistant:

Imputer::Imputer(const Imputer& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  clear_has_ImputedValue();
  switch (from.ImputedValue_case()) {
    case kImputedDoubleValue: {
      set_imputeddoublevalue(from.imputeddoublevalue());
      break;
    }
    case kImputedInt64Value: {
      set_imputedint64value(from.imputedint64value());
      break;
    }
    case kImputedStringValue: {
      set_imputedstringvalue(from.imputedstringvalue());
      break;
    }
    case kImputedDoubleArray: {
      mutable_imputeddoublearray()->::CoreML::Specification::DoubleVector::MergeFrom(from.imputeddoublearray());
      break;
    }
    case kImputedInt64Array: {
      mutable_imputedint64array()->::CoreML::Specification::Int64Vector::MergeFrom(from.imputedint64array());
      break;
    }
    case kImputedStringDictionary: {
      mutable_imputedstringdictionary()->::CoreML::Specification::StringToDoubleMap::MergeFrom(from.imputedstringdictionary());
      break;
    }
    case kImputedInt64Dictionary: {
      mutable_imputedint64dictionary()->::CoreML::Specification::Int64ToDoubleMap::MergeFrom(from.imputedint64dictionary());
      break;
    }
    case IMPUTEDVALUE_NOT_SET: {
      break;
    }
  }
  clear_has_ReplaceValue();
  switch (from.ReplaceValue_case()) {
    case kReplaceDoubleValue: {
      set_replacedoublevalue(from.replacedoublevalue());
      break;
    }
    case kReplaceInt64Value: {
      set_replaceint64value(from.replaceint64value());
      break;
    }
    case kReplaceStringValue: {
      set_replacestringvalue(from.replacestringvalue());
      break;
    }
    case REPLACEVALUE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.Imputer)
}